

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

bool P_Thing_Spawn(int tid,AActor *source,int type,DAngle *angle,bool fog,int newtid)

{
  undefined8 mobj_00;
  bool bVar1;
  uint uVar2;
  PClassActor *pPVar3;
  AActor *pAVar4;
  Angle *local_c8;
  bool local_b2;
  TFlags<ActorFlag2,_unsigned_int> local_a8;
  TFlags<ActorFlag,_unsigned_int> local_a4;
  DVector3 local_a0;
  TFlags<ActorFlag2,_unsigned_int> local_84;
  undefined1 local_80 [4];
  ActorFlags2 oldFlags2;
  TFlags<ActorFlag3,_unsigned_int> local_64;
  undefined1 local_60 [8];
  FActorIterator iterator;
  AActor *mobj;
  AActor *spot;
  PClassActor *kind;
  int rtn;
  int newtid_local;
  bool fog_local;
  DAngle *angle_local;
  int type_local;
  AActor *source_local;
  int tid_local;
  
  kind._4_4_ = 0;
  FActorIterator::FActorIterator((FActorIterator *)local_60,tid);
  pPVar3 = P_GetSpawnableType(type);
  if (pPVar3 == (PClassActor *)0x0) {
    source_local._7_1_ = false;
  }
  else {
    pPVar3 = PClassActor::GetReplacement(pPVar3,true);
    pAVar4 = GetDefaultByType(&pPVar3->super_PClass);
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_64,
               (int)pAVar4 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_64);
    local_b2 = false;
    if (uVar2 != 0) {
      uVar2 = FIntCVar::operator_cast_to_int(&dmflags);
      local_b2 = (uVar2 & 0x1000) != 0 || (level.flags2 & 0x8000) != 0;
    }
    if (local_b2) {
      source_local._7_1_ = false;
    }
    else {
      mobj = source;
      if (tid != 0) {
        mobj = FActorIterator::Next((FActorIterator *)local_60);
      }
      while (mobj != (AActor *)0x0) {
        AActor::Pos((DVector3 *)local_80,mobj);
        iterator._8_8_ = Spawn(pPVar3,(DVector3 *)local_80,ALLOW_REPLACE);
        if ((AActor *)iterator._8_8_ != (AActor *)0x0) {
          TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_84,&((AActor *)iterator._8_8_)->flags2);
          TFlags<ActorFlag2,_unsigned_int>::operator|=
                    ((TFlags<ActorFlag2,_unsigned_int> *)(iterator._8_8_ + 400),MF2_PASSMOBJ);
          bVar1 = P_TestMobjLocation((AActor *)iterator._8_8_);
          if (bVar1) {
            kind._4_4_ = kind._4_4_ + 1;
            bVar1 = TAngle<double>::operator!=(angle,1000000.0);
            local_c8 = angle;
            if (!bVar1) {
              local_c8 = &(mobj->Angles).Yaw;
            }
            TAngle<double>::operator=((TAngle<double> *)(iterator._8_8_ + 0x90),local_c8);
            mobj_00 = iterator._8_8_;
            if (fog) {
              AActor::Pos(&local_a0,mobj);
              P_SpawnTeleportFog((AActor *)mobj_00,&local_a0,false,true);
            }
            TFlags<ActorFlag,_unsigned_int>::operator&
                      (&local_a4,
                       iterator.id + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
            uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_a4);
            if (uVar2 != 0) {
              TFlags<ActorFlag,_unsigned_int>::operator|=
                        ((TFlags<ActorFlag,_unsigned_int> *)(iterator._8_8_ + 0x18c),MF_DROPPED);
            }
            *(int *)(iterator._8_8_ + 0x260) = newtid;
            AActor::AddToHash((AActor *)iterator._8_8_);
            TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_a8,&local_84);
            TFlags<ActorFlag2,_unsigned_int>::operator=
                      ((TFlags<ActorFlag2,_unsigned_int> *)(iterator._8_8_ + 400),&local_a8);
          }
          else {
            AActor::ClearCounters((AActor *)iterator._8_8_);
            (**(code **)(*(long *)iterator._8_8_ + 0x20))();
          }
        }
        mobj = FActorIterator::Next((FActorIterator *)local_60);
      }
      source_local._7_1_ = kind._4_4_ != 0;
    }
  }
  return source_local._7_1_;
}

Assistant:

bool P_Thing_Spawn (int tid, AActor *source, int type, DAngle angle, bool fog, int newtid)
{
	int rtn = 0;
	PClassActor *kind;
	AActor *spot, *mobj;
	FActorIterator iterator (tid);

	kind = P_GetSpawnableType(type);

	if (kind == NULL)
		return false;

	// Handle decorate replacements.
	kind = kind->GetReplacement();

	if ((GetDefaultByType(kind)->flags3 & MF3_ISMONSTER) && 
		((dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS)))
		return false;

	if (tid == 0)
	{
		spot = source;
	}
	else
	{
		spot = iterator.Next();
	}
	while (spot != NULL)
	{
		mobj = Spawn (kind, spot->Pos(), ALLOW_REPLACE);

		if (mobj != NULL)
		{
			ActorFlags2 oldFlags2 = mobj->flags2;
			mobj->flags2 |= MF2_PASSMOBJ;
			if (P_TestMobjLocation (mobj))
			{
				rtn++;
				mobj->Angles.Yaw = (angle != 1000000. ? angle : spot->Angles.Yaw);
				if (fog)
				{
					P_SpawnTeleportFog(mobj, spot->Pos(), false, true);
				}
				if (mobj->flags & MF_SPECIAL)
					mobj->flags |= MF_DROPPED;	// Don't respawn
				mobj->tid = newtid;
				mobj->AddToHash ();
				mobj->flags2 = oldFlags2;
			}
			else
			{
				// If this is a monster, subtract it from the total monster
				// count, because it already added to it during spawning.
				mobj->ClearCounters();
				mobj->Destroy ();
			}
		}
		spot = iterator.Next();
	}

	return rtn != 0;
}